

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O0

void mp::VisitArguments(QuadTerms *lt,function<void_(int)> *argv)

{
  pair<std::pair<int,_int>,_double> *ppVar1;
  ArrayRef<std::pair<std::pair<int,_int>,_double>_> *in_RSI;
  pair<std::pair<int,_int>,_double> v;
  pair<std::pair<int,_int>,_double> *__end1;
  pair<std::pair<int,_int>,_double> *__begin1;
  ArrayRef<std::pair<std::pair<int,_int>,_double>_> *__range1;
  pair<std::pair<int,_int>,_double> *ppVar2;
  QuadTerms *in_stack_ffffffffffffff88;
  pair<std::pair<int,_int>,_double> *local_48;
  undefined1 local_40 [40];
  undefined1 *local_18;
  
  QuadTerms::get_folded(in_stack_ffffffffffffff88);
  local_18 = local_40;
  local_48 = ArrayRef<std::pair<std::pair<int,_int>,_double>_>::begin
                       ((ArrayRef<std::pair<std::pair<int,_int>,_double>_> *)0x705cfd);
  ppVar1 = ArrayRef<std::pair<std::pair<int,_int>,_double>_>::end(in_RSI);
  ppVar2 = ppVar1;
  for (; local_48 != ppVar1; local_48 = local_48 + 1) {
    std::function<void_(int)>::operator()
              ((function<void_(int)> *)in_RSI,(int)((ulong)ppVar2 >> 0x20));
    std::function<void_(int)>::operator()
              ((function<void_(int)> *)in_RSI,(int)((ulong)ppVar2 >> 0x20));
  }
  ArrayRef<std::pair<std::pair<int,_int>,_double>_>::~ArrayRef
            ((ArrayRef<std::pair<std::pair<int,_int>,_double>_> *)0x705d40);
  return;
}

Assistant:

void VisitArguments(const QuadTerms& lt, std::function<void (int)> argv) {
  for (auto v: lt.get_folded()) {
    argv(v.first.first);
    argv(v.first.second);
  }
}